

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_addi_8_ai(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar4 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  uVar1 = m68k_read_memory_16(uVar4 & m68ki_cpu.address_mask);
  uVar4 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = uVar4;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar4);
  }
  uVar3 = m68k_read_memory_8(uVar2 & m68ki_cpu.address_mask);
  m68ki_cpu.x_flag = uVar3 + (uVar1 & 0xff);
  m68ki_cpu.v_flag = (uVar3 ^ m68ki_cpu.x_flag) & (uVar1 & 0xff ^ m68ki_cpu.x_flag);
  uVar1 = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.not_z_flag = uVar1;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(uVar4);
  }
  m68k_write_memory_8(uVar4 & m68ki_cpu.address_mask,uVar1);
  return;
}

Assistant:

static void m68k_op_addi_8_ai(void)
{
	uint src = OPER_I_8();
	uint ea = EA_AY_AI_8();
	uint dst = m68ki_read_8(ea);
	uint res = src + dst;

	FLAG_N = NFLAG_8(res);
	FLAG_V = VFLAG_ADD_8(src, dst, res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	m68ki_write_8(ea, FLAG_Z);
}